

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

UINT16 TPMS_TAGGED_PCR_SELECT_Marshal(TPMS_TAGGED_PCR_SELECT *source,BYTE **buffer,INT32 *size)

{
  UINT16 UVar1;
  
  UINT32_Marshal(&source->tag,buffer,size);
  UINT8_Marshal(&source->sizeofSelect,buffer,size);
  UVar1 = BYTE_Array_Marshal(source->pcrSelect,buffer,size,(uint)source->sizeofSelect);
  return UVar1 + 5;
}

Assistant:

UINT16
TPMS_TAGGED_PCR_SELECT_Marshal(TPMS_TAGGED_PCR_SELECT *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + TPM_PT_PCR_Marshal((TPM_PT_PCR *)&(source->tag), buffer, size));
    result = (UINT16)(result + UINT8_Marshal((UINT8 *)&(source->sizeofSelect), buffer, size));
    result = (UINT16)(result + BYTE_Array_Marshal((BYTE *)(source->pcrSelect), buffer, size, (INT32)(source->sizeofSelect)));
    return result;
}